

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::GenerateFastArrayIsIn(Lowerer *this,Instr *instr)

{
  Opnd *pOVar1;
  ScriptContextInfo *pSVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  int iVar6;
  LabelInstr *labelFail;
  LabelInstr *target;
  LabelInstr *target_00;
  undefined4 *puVar7;
  RegOpnd *pRVar8;
  RegOpnd *pRVar9;
  Lowerer *pLVar10;
  undefined4 extraout_var;
  AddrOpnd *pAVar11;
  IndirOpnd *pIVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  IntConstOpnd *pIVar13;
  undefined4 extraout_var_02;
  Lowerer *pLVar14;
  undefined1 local_98 [8];
  AutoReuseOpnd autoReuseArrayOpnd;
  AutoReuseOpnd autoReuseHeadSegmentOpnd;
  AutoReuseOpnd autoReuseHeadSegmentLengthOpnd;
  
  pRVar8 = (RegOpnd *)instr->m_src1;
  pOVar1 = instr->m_src2;
  local_98._0_2_ = (pRVar8->super_Opnd).m_valueType.field_0.bits;
  bVar4 = ValueType::IsLikelyInt((ValueType *)local_98);
  if (bVar4) {
    bVar4 = IR::Opnd::IsNotInt((Opnd *)pRVar8);
    if (bVar4) {
      return;
    }
    autoReuseArrayOpnd._16_2_ = (pOVar1->m_valueType).field_0.bits;
    bVar4 = ValueType::IsLikelyArray((ValueType *)&autoReuseArrayOpnd.autoDelete);
    if (!bVar4) {
      return;
    }
    autoReuseHeadSegmentOpnd._16_2_ = (pOVar1->m_valueType).field_0.bits;
    bVar4 = ValueType::HasNoMissingValues((ValueType *)&autoReuseHeadSegmentOpnd.autoDelete);
    if (!bVar4) {
      return;
    }
    labelFail = IR::LabelInstr::New(Label,this->m_func,true);
    target = IR::LabelInstr::New(Label,this->m_func,false);
    target_00 = IR::LabelInstr::New(Label,this->m_func,false);
    OVar5 = IR::Opnd::GetKind((Opnd *)pRVar8);
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_005ab13f;
      *puVar7 = 0;
    }
    pRVar8 = GenerateUntagVar(this,pRVar8,labelFail,instr,true);
    pRVar9 = IR::RegOpnd::New(TyUint64,this->m_func);
    InsertMove(&pRVar9->super_Opnd,pOVar1,instr,true);
    local_98 = (undefined1  [8])0x0;
    autoReuseArrayOpnd.func._1_1_ = 1;
    LowererMD::GenerateObjectTest(&this->m_lowererMD,&pRVar9->super_Opnd,instr,labelFail,false);
    pLVar10 = (Lowerer *)IR::Opnd::Copy(&pRVar9->super_Opnd,instr->m_func);
    OVar5 = IR::Opnd::GetKind((Opnd *)pLVar10);
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) {
LAB_005ab13f:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_98,(Opnd *)pLVar10,instr->m_func,false);
    pSVar2 = instr->m_func->m_scriptContextInfo;
    iVar6 = (*pSVar2->_vptr_ScriptContextInfo[0x21])(pSVar2,7);
    pAVar11 = IR::AddrOpnd::New((Var)CONCAT44(extraout_var,iVar6),AddrOpndKindDynamicVtable,
                                this->m_func,false,(Var)0x0);
    pLVar14 = pLVar10;
    pIVar12 = IR::IndirOpnd::New((RegOpnd *)pLVar10,0,TyUint64,instr->m_func,false);
    InsertCompareBranch(pLVar14,&pIVar12->super_Opnd,&pAVar11->super_Opnd,BrEq_A,false,target_00,
                        instr,false);
    pSVar2 = instr->m_func->m_scriptContextInfo;
    iVar6 = (*pSVar2->_vptr_ScriptContextInfo[0x21])(pSVar2,0x1f);
    pAVar11 = IR::AddrOpnd::New((Var)CONCAT44(extraout_var_00,iVar6),AddrOpndKindDynamicVtable,
                                this->m_func,false,(Var)0x0);
    pLVar14 = pLVar10;
    pIVar12 = IR::IndirOpnd::New((RegOpnd *)pLVar10,0,TyUint64,instr->m_func,false);
    InsertCompareBranch(pLVar14,&pIVar12->super_Opnd,&pAVar11->super_Opnd,BrEq_A,false,target_00,
                        instr,false);
    pSVar2 = instr->m_func->m_scriptContextInfo;
    iVar6 = (*pSVar2->_vptr_ScriptContextInfo[0x21])(pSVar2,0x21);
    pAVar11 = IR::AddrOpnd::New((Var)CONCAT44(extraout_var_01,iVar6),AddrOpndKindDynamicVtable,
                                this->m_func,false,(Var)0x0);
    pIVar12 = IR::IndirOpnd::New((RegOpnd *)pLVar10,0,TyUint64,instr->m_func,false);
    InsertCompareBranch(pLVar10,&pIVar12->super_Opnd,&pAVar11->super_Opnd,BrNeq_A,false,labelFail,
                        instr,false);
    IR::Instr::InsertBefore(instr,&target_00->super_Instr);
    pIVar12 = IR::IndirOpnd::New(pRVar9,0x18,TyUint8,this->m_func,false);
    pIVar13 = IR::IntConstOpnd::New(4,TyUint8,this->m_func,true);
    InsertTest(&pIVar12->super_Opnd,&pIVar13->super_Opnd,instr);
    InsertBranch(BrEq_A,false,labelFail,instr);
    autoReuseArrayOpnd.autoDelete = false;
    autoReuseArrayOpnd.wasInUse = false;
    autoReuseArrayOpnd._18_6_ = 0;
    autoReuseHeadSegmentOpnd.func._1_1_ = 1;
    autoReuseHeadSegmentOpnd.autoDelete = false;
    autoReuseHeadSegmentOpnd.wasInUse = false;
    autoReuseHeadSegmentOpnd._18_6_ = 0;
    pIVar12 = IR::IndirOpnd::New(pRVar9,0x28,TyUint64,this->m_func,false);
    pRVar9 = IR::RegOpnd::New(TyUint64,this->m_func);
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)&autoReuseArrayOpnd.autoDelete,&pRVar9->super_Opnd,this->m_func,true
              );
    InsertMove(&pRVar9->super_Opnd,&pIVar12->super_Opnd,instr,true);
    pIVar12 = IR::IndirOpnd::New(pRVar9,4,TyUint32,this->m_func,false);
    pLVar10 = (Lowerer *)&autoReuseHeadSegmentOpnd.autoDelete;
    IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)pLVar10,&pIVar12->super_Opnd,this->m_func,true);
    InsertCompareBranch(pLVar10,&pRVar8->super_Opnd,&pIVar12->super_Opnd,BrGe_A,false,labelFail,
                        instr,false);
    pLVar10 = (Lowerer *)0x0;
    pIVar13 = IR::IntConstOpnd::New(0,(pRVar8->super_Opnd).m_type,this->m_func,false);
    InsertCompareBranch(pLVar10,&pRVar8->super_Opnd,&pIVar13->super_Opnd,BrLt_A,false,labelFail,
                        instr,false);
    pOVar1 = instr->m_dst;
    iVar6 = (*instr->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[2])();
    pAVar11 = IR::AddrOpnd::New(CONCAT44(extraout_var_02,iVar6),AddrOpndKindDynamicVar,instr->m_func
                                ,true,(Var)0x0);
    InsertMove(pOVar1,&pAVar11->super_Opnd,instr,true);
    InsertBranch(Br,false,target,instr);
    IR::Instr::InsertBefore(instr,&labelFail->super_Instr);
    IR::Instr::InsertAfter(instr,&target->super_Instr);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseHeadSegmentOpnd.autoDelete);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseArrayOpnd.autoDelete);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_98);
  }
  return;
}

Assistant:

void Lowerer::GenerateFastArrayIsIn(IR::Instr * instr)
{
    // operator "foo in bar"
    IR::Opnd* src1 = instr->GetSrc1(); // foo
    IR::Opnd* src2 = instr->GetSrc2(); // bar

    if (
        !src1->GetValueType().IsLikelyInt() ||
        // Do not do a fast path if we know for sure we don't have an int
        src1->IsNotInt() ||
        !src2->GetValueType().IsLikelyArray() ||
        !src2->GetValueType().HasNoMissingValues())
    {
        return;
    }

    IR::LabelInstr* helperLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    IR::LabelInstr* doneLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);
    IR::LabelInstr* isArrayLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);

    IR::RegOpnd* src1Untagged = GenerateUntagVar(src1->AsRegOpnd(), helperLabel, instr);
    IR::RegOpnd* src2RegOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(src2RegOpnd, src2, instr);


    IR::AutoReuseOpnd autoReuseArrayOpnd;
    m_lowererMD.GenerateObjectTest(src2RegOpnd, instr, helperLabel);
    IR::RegOpnd* arrayOpnd = src2RegOpnd->Copy(instr->m_func)->AsRegOpnd();
    autoReuseArrayOpnd.Initialize(arrayOpnd, instr->m_func, false /* autoDelete */);

    IR::Opnd* vtableOpnd = LoadVTableValueOpnd(instr, VTableValue::VtableJavascriptArray);
    InsertCompareBranch(
        IR::IndirOpnd::New(arrayOpnd, 0, TyMachPtr, instr->m_func),
        vtableOpnd,
        Js::OpCode::BrEq_A,
        isArrayLabel,
        instr);

    vtableOpnd = LoadVTableValueOpnd(instr, VTableValue::VtableNativeIntArray);
    InsertCompareBranch(
        IR::IndirOpnd::New(arrayOpnd, 0, TyMachPtr, instr->m_func),
        vtableOpnd,
        Js::OpCode::BrEq_A,
        isArrayLabel,
        instr);

    vtableOpnd = LoadVTableValueOpnd(instr, VTableValue::VtableNativeFloatArray);
    InsertCompareBranch(
        IR::IndirOpnd::New(arrayOpnd, 0, TyMachPtr, instr->m_func),
        vtableOpnd,
        Js::OpCode::BrNeq_A,
        helperLabel,
        instr);

    instr->InsertBefore(isArrayLabel);

    InsertTestBranch(
        IR::IndirOpnd::New(src2RegOpnd, Js::JavascriptArray::GetOffsetOfArrayFlags(), TyUint8, m_func),
        IR::IntConstOpnd::New(static_cast<uint8>(Js::DynamicObjectFlags::HasNoMissingValues), TyUint8, m_func, true),
        Js::OpCode::BrEq_A,
        helperLabel,
        instr);

    IR::AutoReuseOpnd autoReuseHeadSegmentOpnd;
    IR::AutoReuseOpnd autoReuseHeadSegmentLengthOpnd;
    IR::IndirOpnd* indirOpnd = IR::IndirOpnd::New(src2RegOpnd, Js::JavascriptArray::GetOffsetOfHead(), TyMachPtr, this->m_func);
    IR::RegOpnd* headSegmentOpnd = IR::RegOpnd::New(TyMachPtr, this->m_func);
    autoReuseHeadSegmentOpnd.Initialize(headSegmentOpnd, m_func);
    InsertMove(headSegmentOpnd, indirOpnd, instr);

    IR::Opnd* headSegmentLengthOpnd = IR::IndirOpnd::New(headSegmentOpnd, Js::SparseArraySegmentBase::GetOffsetOfLength(), TyUint32, m_func);
    autoReuseHeadSegmentLengthOpnd.Initialize(headSegmentLengthOpnd, m_func);

    InsertCompareBranch(
        src1Untagged,
        headSegmentLengthOpnd,
        Js::OpCode::BrGe_A,
        helperLabel,
        instr);
    InsertCompareBranch(
        src1Untagged,
        IR::IntConstOpnd::New(0, src1Untagged->GetType(), this->m_func),
        Js::OpCode::BrLt_A,
        helperLabel,
        instr);

    InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueTrue), instr);
    InsertBranch(Js::OpCode::Br, doneLabel, instr);

    instr->InsertBefore(helperLabel);

    instr->InsertAfter(doneLabel);
}